

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall CExtKey::SetSeed(CExtKey *this,Span<const_std::byte> seed)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  CHMAC_SHA512 *this_00;
  uchar *puVar4;
  uchar *pbegin;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *this_01;
  undefined1 *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  Span<const_std::byte> *in_stack_fffffffffffffdd8;
  uchar *in_stack_fffffffffffffde0;
  CHMAC_SHA512 *in_stack_fffffffffffffde8;
  CHMAC_SHA512 *in_stack_fffffffffffffdf0;
  undefined1 fCompressedIn;
  allocator_type *in_stack_fffffffffffffdf8;
  size_type in_stack_fffffffffffffe00;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  undefined1 local_1c0 [440];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  CHMAC_SHA512::CHMAC_SHA512
            (in_stack_fffffffffffffdf0,(uchar *)in_stack_fffffffffffffde8,
             (size_t)in_stack_fffffffffffffde0);
  Span<const_std::byte>::data(in_stack_fffffffffffffdd8);
  UCharCast((byte *)in_stack_fffffffffffffdd8);
  Span<const_std::byte>::size(in_stack_fffffffffffffdd8);
  this_00 = CHMAC_SHA512::Write(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                (size_t)in_stack_fffffffffffffdd8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8);
  CHMAC_SHA512::Finalize(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  puVar4 = in_RDI + 0x30;
  fCompressedIn = (undefined1)((ulong)local_1c0 >> 0x38);
  pbegin = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffdd8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8);
  CKey::Set<unsigned_char*>((CKey *)this_00,pbegin,puVar4,(bool)fCompressedIn);
  this_01 = (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
            base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffdd8);
  puVar4 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffdd8);
  puVar1 = *(pointer *)(puVar4 + 0x20);
  puVar2 = *(pointer *)(puVar4 + 0x28);
  puVar3 = *(pointer *)(puVar4 + 0x38);
  (this_01->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(puVar4 + 0x30);
  this_01[1].super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  (this_01->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this_01->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::SetSeed(Span<const std::byte> seed)
{
    static const unsigned char hashkey[] = {'B','i','t','c','o','i','n',' ','s','e','e','d'};
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    CHMAC_SHA512{hashkey, sizeof(hashkey)}.Write(UCharCast(seed.data()), seed.size()).Finalize(vout.data());
    key.Set(vout.data(), vout.data() + 32, true);
    memcpy(chaincode.begin(), vout.data() + 32, 32);
    nDepth = 0;
    nChild = 0;
    memset(vchFingerprint, 0, sizeof(vchFingerprint));
}